

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

CppType __thiscall google::protobuf::MapValueConstRef::type(MapValueConstRef *this)

{
  LogMessage *pLVar1;
  LogFinisher local_55 [13];
  LogMessage local_48;
  MapValueConstRef *local_10;
  MapValueConstRef *this_local;
  
  if ((this->type_ == 0) || (this->data_ == (void *)0x0)) {
    local_10 = this;
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x2ed);
    pLVar1 = internal::LogMessage::operator<<(&local_48,"Protocol Buffer map usage error:\n");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"MapValueConstRef::type MapValueConstRef is not initialized.");
    internal::LogFinisher::operator=(local_55,pLVar1);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return this->type_;
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == FieldDescriptor::CppType() || data_ == nullptr) {
      GOOGLE_LOG(FATAL)
          << "Protocol Buffer map usage error:\n"
          << "MapValueConstRef::type MapValueConstRef is not initialized.";
    }
    return type_;
  }